

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall CSnapIDPool::RemoveFirstTimeout(CSnapIDPool *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = this->m_FirstTimed;
  iVar3 = (int)this->m_aIDs[iVar1].m_Next;
  iVar2 = this->m_FirstFree;
  this->m_aIDs[iVar1].m_State = 0;
  this->m_aIDs[iVar1].m_Next = (short)iVar2;
  this->m_FirstFree = iVar1;
  this->m_FirstTimed = iVar3;
  if (iVar3 == -1) {
    this->m_LastTimed = -1;
  }
  this->m_Usage = this->m_Usage + -1;
  return;
}

Assistant:

void CSnapIDPool::RemoveFirstTimeout()
{
	int NextTimed = m_aIDs[m_FirstTimed].m_Next;

	// add it to the free list
	m_aIDs[m_FirstTimed].m_Next = m_FirstFree;
	m_aIDs[m_FirstTimed].m_State = 0;
	m_FirstFree = m_FirstTimed;

	// remove it from the timed list
	m_FirstTimed = NextTimed;
	if(m_FirstTimed == -1)
		m_LastTimed = -1;

	m_Usage--;
}